

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# future.hpp
# Opt level: O0

void __thiscall mxx::requests::~requests(requests *this)

{
  requests *this_local;
  
  this->_vptr_requests = (_func_int **)&PTR__requests_0019a168;
  waitall(this);
  std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::~vector(&this->m_requests);
  return;
}

Assistant:

virtual ~requests() {
        this->waitall();
    }